

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadUnix.c
# Opt level: O2

deUint32 deGetNumAvailableLogicalCores(void)

{
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  long lVar4;
  
  lVar4 = syscall(0xcc,0,8);
  if (lVar4 < 1) {
    lVar4 = sysconf(0x54);
    dVar3 = 1;
    if (1 < lVar4) {
      dVar3 = (deUint32)lVar4;
    }
  }
  else {
    iVar1 = dePop32(0);
    iVar2 = dePop32(0);
    dVar3 = iVar2 + iVar1;
  }
  return dVar3;
}

Assistant:

deUint32 deGetNumAvailableLogicalCores (void)
{
	unsigned long		mask		= 0;
	const unsigned int	maskSize	= sizeof(mask);
	long				ret;

	deMemset(&mask, 0, sizeof(mask));

	ret = syscall(__NR_sched_getaffinity, 0, maskSize, &mask);

	if (ret > 0)
	{
		return (deUint32)dePop64(mask);
	}
	else
	{
#if defined(_SC_NPROCESSORS_ONLN)
		const long count = sysconf(_SC_NPROCESSORS_ONLN);

		if (count <= 0)
			return 1;
		else
			return (deUint32)count;
#else
		return 1;
#endif
	}
}